

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfInterface.c
# Opt level: O2

sbfError sbfInterface_parseAddress(char *s,sockaddr_in *sin)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  ulong uVar3;
  sbfError sVar4;
  sbfError sVar5;
  char *endptr;
  
  __s = sbfMemory_strdup(s);
  pcVar2 = strchr(__s,0x3a);
  sVar4 = 0x16;
  sVar5 = sVar4;
  if ((pcVar2 != (char *)0x0) && (pcVar2[1] != '\0')) {
    uVar3 = strtoul(pcVar2 + 1,&endptr,10);
    sVar5 = 0x22;
    if ((0xffffffffffff0000 < uVar3 - 0x10000) && (*endptr == '\0')) {
      sin->sin_port = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
      *pcVar2 = '\0';
      iVar1 = inet_pton(2,__s,&sin->sin_addr);
      sVar5 = sVar4;
      if (iVar1 != 0) {
        sin->sin_family = 2;
        sVar5 = 0;
      }
    }
  }
  free(__s);
  return sVar5;
}

Assistant:

sbfError
sbfInterface_parseAddress (const char* s, struct sockaddr_in* sin)
{
    char*         copy;
    char*         cp;
    char*         endptr;
    unsigned long ul;

    copy = xstrdup (s);

    cp = strchr (copy, ':');
    if (cp == NULL || cp[1] == '\0')
    {
        free (copy);
        return EINVAL;
    }

    ul = strtoul (cp + 1, &endptr, 10);
    if (ul == 0 || ul > UINT16_MAX || *endptr != '\0')
    {
        free (copy);
        return ERANGE;
    }
    sin->sin_port = ntohs ((u_short)ul);

    *cp = '\0';
    if (inet_pton (AF_INET, copy, &sin->sin_addr) == 0)
    {
        free (copy);
        return EINVAL;
    }
    sin->sin_family = AF_INET;

    free (copy);
    return 0;
}